

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::enable_nonlinear(Nes_Apu *this,double v)

{
  Nes_Apu *in_RDI;
  double tnd;
  double in_stack_ffffffffffffffd8;
  
  (in_RDI->dmc).nonlinear = true;
  Blip_Synth<3,_15>::volume((Blip_Synth<3,_15> *)in_RDI,in_stack_ffffffffffffffd8);
  Blip_Synth<3,_15>::volume_unit((Blip_Synth<3,_15> *)in_RDI,in_stack_ffffffffffffffd8);
  Blip_Synth<2,_15>::volume_unit((Blip_Synth<2,_15> *)in_RDI,in_stack_ffffffffffffffd8);
  Blip_Synth<2,_127>::volume_unit((Blip_Synth<2,_127> *)in_RDI,in_stack_ffffffffffffffd8);
  buffer_cleared(in_RDI);
  return;
}

Assistant:

void Nes_Apu::enable_nonlinear( double v )
{
	dmc.nonlinear = true;
	square_synth.volume( 1.3 * 0.25751258 / 0.742467605 * 0.25 * v );
	
	const double tnd = 0.75 / 202 * 0.48;
	triangle.synth.volume_unit( 3 * tnd );
	noise.synth.volume_unit( 2 * tnd );
	dmc.synth.volume_unit( tnd );
	
	buffer_cleared();
}